

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void VP8LHistogramStoreRefs
               (VP8LBackwardRefs *refs,_func_int_int_int *distance_modifier,
               int distance_modifier_arg0,VP8LHistogram *histo)

{
  VP8LRefsCursor c;
  VP8LRefsCursor local_38;
  
  VP8LRefsCursorInit(&local_38,refs);
  while (local_38.cur_pos != (PixOrCopy *)0x0) {
    HistogramAddSinglePixOrCopy(histo,local_38.cur_pos,distance_modifier,distance_modifier_arg0);
    local_38.cur_pos = local_38.cur_pos + 1;
    if (local_38.cur_pos == local_38.last_pos) {
      VP8LRefsCursorNextBlock(&local_38);
    }
  }
  return;
}

Assistant:

void VP8LHistogramStoreRefs(const VP8LBackwardRefs* const refs,
                            int (*const distance_modifier)(int, int),
                            int distance_modifier_arg0,
                            VP8LHistogram* const histo) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    HistogramAddSinglePixOrCopy(histo, c.cur_pos, distance_modifier,
                                distance_modifier_arg0);
    VP8LRefsCursorNext(&c);
  }
}